

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int a;
  int b;
  int iVar1;
  float *pfVar2;
  uchar *__ptr;
  long lVar3;
  int *piVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  stbi__result_info *in_R9;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uchar *puVar11;
  float *pfVar12;
  bool bVar13;
  float fVar14;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    piVar4 = comp;
    iVar1 = req_comp;
    __ptr = stbi__load_and_postprocess_8bit(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      stbi__g_failure_reason = "unknown image type";
    }
    else {
      a = *x;
      b = *y;
      if (req_comp == 0) {
        req_comp = *comp;
      }
      pfVar2 = (float *)stbi__malloc_mad4(a,b,req_comp,(int)piVar4,iVar1);
      if (pfVar2 != (float *)0x0) {
        uVar5 = req_comp - (uint)((req_comp & 1U) == 0);
        uVar9 = b * a;
        lVar6 = (long)req_comp;
        uVar10 = (ulong)(~((int)uVar9 >> 0x1f) & uVar9);
        puVar11 = __ptr;
        pfVar12 = pfVar2;
        for (uVar7 = 0; uVar7 != uVar10; uVar7 = uVar7 + 1) {
          for (uVar8 = 0; (~((int)uVar5 >> 0x1f) & uVar5) != uVar8; uVar8 = uVar8 + 1) {
            fVar14 = powf((float)puVar11[uVar8] / 255.0,stbi__l2h_gamma);
            pfVar12[uVar8] = fVar14 * stbi__l2h_scale;
          }
          pfVar12 = pfVar12 + lVar6;
          puVar11 = puVar11 + lVar6;
        }
        if ((req_comp & 1U) == 0) {
          lVar3 = (long)(int)uVar5;
          while (bVar13 = uVar10 != 0, uVar10 = uVar10 - 1, bVar13) {
            pfVar2[lVar3] = (float)__ptr[lVar3] / 255.0;
            lVar3 = lVar3 + lVar6;
          }
        }
        free(__ptr);
        return pfVar2;
      }
      free(__ptr);
      stbi__g_failure_reason = "outofmem";
    }
    pfVar2 = (float *)0x0;
  }
  else {
    pfVar2 = stbi__hdr_load(s,x,y,comp,req_comp,in_R9);
    if ((pfVar2 != (float *)0x0) && (stbi__vertically_flip_on_load != 0)) {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      stbi__vertical_flip(pfVar2,*x,*y,req_comp << 2);
    }
  }
  return pfVar2;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      stbi__result_info ri;
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp, &ri);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_and_postprocess_8bit(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}